

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# substitute.h
# Opt level: O0

void absl::SubstituteAndAppend
               (Nonnull<std::string_*> output,string_view format,Arg *a0,Arg *a1,Arg *a2)

{
  Arg *in_RCX;
  Arg *in_R8;
  Arg *in_R9;
  string_view args [3];
  size_t in_stack_00000180;
  Nullable<const_absl::string_view_*> in_stack_00000188;
  Nonnull<std::string_*> in_stack_00000190;
  undefined1 in_stack_00000198 [16];
  
  substitute_internal::Arg::piece(in_RCX);
  substitute_internal::Arg::piece(in_R8);
  substitute_internal::Arg::piece(in_R9);
  substitute_internal::SubstituteAndAppendArray
            (in_stack_00000190,(string_view)in_stack_00000198,in_stack_00000188,in_stack_00000180);
  return;
}

Assistant:

inline void SubstituteAndAppend(absl::Nonnull<std::string*> output,
                                absl::string_view format,
                                const substitute_internal::Arg& a0,
                                const substitute_internal::Arg& a1,
                                const substitute_internal::Arg& a2) {
  const absl::string_view args[] = {a0.piece(), a1.piece(), a2.piece()};
  substitute_internal::SubstituteAndAppendArray(output, format, args,
                                                ABSL_ARRAYSIZE(args));
}